

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

int stbtt_GetGlyphKernAdvance(stbtt_fontinfo *info,int g1,int g2)

{
  ushort uVar1;
  uchar *puVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  ushort uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ushort uVar12;
  ushort uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  ushort uVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  
  lVar8 = (long)info->gpos;
  uVar17 = 0;
  uVar25 = 0;
  if (((lVar8 != 0) &&
      (puVar2 = info->data, uVar25 = uVar17,
      (ushort)(*(ushort *)(puVar2 + lVar8) << 8 | *(ushort *)(puVar2 + lVar8) >> 8) == 1)) &&
     (puVar2[lVar8 + 3] == '\0' && puVar2[lVar8 + 2] == '\0')) {
    uVar11 = (ulong)(ushort)(*(ushort *)(puVar2 + lVar8 + 8) << 8 |
                            *(ushort *)(puVar2 + lVar8 + 8) >> 8);
    uVar18 = *(ushort *)(puVar2 + uVar11 + lVar8) << 8 | *(ushort *)(puVar2 + uVar11 + lVar8) >> 8;
    if (uVar18 != 0) {
      lVar8 = uVar11 + lVar8;
      uVar11 = 0;
      uVar25 = 0;
      do {
        uVar10 = (ulong)(ushort)(*(ushort *)(puVar2 + uVar11 * 2 + lVar8 + 2) << 8 |
                                *(ushort *)(puVar2 + uVar11 * 2 + lVar8 + 2) >> 8);
        bVar6 = true;
        if ((ushort)(*(ushort *)(puVar2 + uVar10 + lVar8) << 8 |
                    *(ushort *)(puVar2 + uVar10 + lVar8) >> 8) == 2) {
          lVar3 = uVar10 + lVar8;
          uVar7 = *(ushort *)(puVar2 + lVar3 + 4) << 8 | *(ushort *)(puVar2 + lVar3 + 4) >> 8;
          if (uVar7 != 0) {
            uVar10 = 0;
            do {
              uVar9 = (ulong)(ushort)(*(ushort *)(puVar2 + uVar10 * 2 + lVar3 + 6) << 8 |
                                     *(ushort *)(puVar2 + uVar10 * 2 + lVar3 + 6) >> 8);
              lVar21 = uVar9 + lVar3;
              uVar15 = (ulong)(ushort)(*(ushort *)(puVar2 + uVar9 + lVar3 + 2) << 8 |
                                      *(ushort *)(puVar2 + uVar9 + lVar3 + 2) >> 8);
              lVar5 = uVar15 + lVar21;
              uVar12 = *(ushort *)(puVar2 + uVar15 + lVar21) << 8 |
                       *(ushort *)(puVar2 + uVar15 + lVar21) >> 8;
              if (uVar12 == 2) {
                uVar12 = *(ushort *)(puVar2 + lVar5 + 2) << 8 | *(ushort *)(puVar2 + lVar5 + 2) >> 8
                ;
                uVar17 = (uint)uVar12;
                iVar14 = uVar12 - 1;
                iVar16 = 0;
                do {
                  iVar19 = iVar16;
                  iVar20 = iVar14;
                  if (iVar20 < iVar19) break;
                  iVar23 = iVar19 + iVar20 >> 1;
                  lVar4 = (long)iVar23 * 6;
                  uVar22 = (uint)(ushort)(*(ushort *)(puVar2 + lVar4 + lVar5 + 4) << 8 |
                                         *(ushort *)(puVar2 + lVar4 + lVar5 + 4) >> 8);
                  iVar16 = iVar19;
                  if (g1 < (int)uVar22) {
                    bVar6 = true;
                    iVar14 = iVar23 + -1;
                  }
                  else {
                    iVar14 = iVar20;
                    if ((int)(uint)(ushort)(*(ushort *)(puVar2 + lVar4 + lVar5 + 6) << 8 |
                                           *(ushort *)(puVar2 + lVar4 + lVar5 + 6) >> 8) < g1) {
                      bVar6 = true;
                      iVar16 = iVar23 + 1;
                    }
                    else {
                      uVar17 = (g1 - uVar22) +
                               (uint)(ushort)(*(ushort *)(puVar2 + lVar4 + lVar5 + 8) << 8 |
                                             *(ushort *)(puVar2 + lVar4 + lVar5 + 8) >> 8);
                      bVar6 = false;
                    }
                  }
                } while (bVar6);
              }
              else {
                if (uVar12 != 1) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                                ,0x92f,"stbtt_int32 stbtt__GetCoverageIndex(stbtt_uint8 *, int)");
                }
                uVar12 = *(ushort *)(puVar2 + lVar5 + 2) << 8 | *(ushort *)(puVar2 + lVar5 + 2) >> 8
                ;
                uVar17 = (uint)uVar12;
                iVar14 = uVar12 - 1;
                iVar16 = 0;
                do {
                  iVar19 = iVar16;
                  iVar20 = iVar14;
                  if (iVar20 < iVar19) break;
                  uVar24 = iVar19 + iVar20 >> 1;
                  uVar22 = (uint)(ushort)(*(ushort *)
                                           (puVar2 + ((long)(iVar19 + iVar20) & 0xfffffffffffffffeU)
                                                     + lVar5 + 4) << 8 |
                                         *(ushort *)
                                          (puVar2 + ((long)(iVar19 + iVar20) & 0xfffffffffffffffeU)
                                                    + lVar5 + 4) >> 8);
                  iVar16 = iVar19;
                  if (g1 < (int)uVar22) {
                    bVar6 = true;
                    iVar14 = uVar24 - 1;
                  }
                  else {
                    iVar14 = iVar20;
                    if ((int)uVar22 < g1) {
                      bVar6 = true;
                      iVar16 = uVar24 + 1;
                    }
                    else {
                      bVar6 = false;
                      uVar17 = uVar24;
                    }
                  }
                } while (bVar6);
              }
              if (iVar20 < iVar19) {
                uVar17 = 0xffffffff;
              }
              if (uVar17 == 0xffffffff) {
                uVar17 = 8;
              }
              else {
                uVar12 = *(ushort *)(puVar2 + uVar9 + lVar3) << 8 |
                         *(ushort *)(puVar2 + uVar9 + lVar3) >> 8;
                if (uVar12 == 2) {
                  uVar12 = *(ushort *)(puVar2 + lVar21 + 4);
                  uVar1 = *(ushort *)(puVar2 + lVar21 + 6);
                  uVar13 = *(ushort *)(puVar2 + lVar21 + 10);
                  uVar17 = stbtt__GetGlyphClass
                                     (puVar2 + (ulong)(ushort)(*(ushort *)(puVar2 + lVar21 + 8) << 8
                                                              | *(ushort *)(puVar2 + lVar21 + 8) >>
                                                                8) + lVar21,g1);
                  uVar22 = stbtt__GetGlyphClass
                                     (puVar2 + (ulong)(ushort)(uVar13 << 8 | uVar13 >> 8) + lVar21,
                                      g2);
                  if ((int)(uint)(ushort)(*(ushort *)(puVar2 + lVar21 + 0xc) << 8 |
                                         *(ushort *)(puVar2 + lVar21 + 0xc) >> 8) <= (int)uVar17) {
                    __assert_fail("glyph1class < class1Count",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                                  ,0x9c5,
                                  "stbtt_int32 stbtt__GetGlyphGPOSInfoAdvance(const stbtt_fontinfo *, int, int)"
                                 );
                  }
                  uVar13 = *(ushort *)(puVar2 + lVar21 + 0xe) << 8 |
                           *(ushort *)(puVar2 + lVar21 + 0xe) >> 8;
                  if ((int)(uint)uVar13 <= (int)uVar22) {
                    __assert_fail("glyph2class < class2Count",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                                  ,0x9c6,
                                  "stbtt_int32 stbtt__GetGlyphGPOSInfoAdvance(const stbtt_fontinfo *, int, int)"
                                 );
                  }
                  bVar6 = false;
                  if ((ushort)(uVar12 << 8 | uVar12 >> 8) == 4) {
                    uVar24 = 0;
                    if ((uVar1 & 0xff) == 0 && uVar1 >> 8 == 0) {
                      if ((int)(uVar22 | uVar17) < 0) {
                        bVar6 = true;
                        uVar24 = uVar25;
                      }
                      else {
                        lVar21 = (ulong)(uVar17 * uVar13 * 2) + lVar21;
                        bVar6 = false;
                        uVar24 = (int)(short)((ushort)puVar2[(ulong)uVar22 * 2 + lVar21 + 0x10] << 8
                                             ) | (uint)puVar2[(ulong)uVar22 * 2 + lVar21 + 0x11];
                      }
                    }
                  }
                  else {
                    uVar24 = 0;
                  }
                  uVar25 = uVar24;
                  uVar17 = 1;
                  if (bVar6) goto LAB_001337d4;
                }
                else {
                  if (uVar12 != 1) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                                  ,0x9d8,
                                  "stbtt_int32 stbtt__GetGlyphGPOSInfoAdvance(const stbtt_fontinfo *, int, int)"
                                 );
                  }
                  bVar6 = false;
                  if ((ushort)(*(ushort *)(puVar2 + lVar21 + 4) << 8 |
                              *(ushort *)(puVar2 + lVar21 + 4) >> 8) == 4) {
                    uVar22 = 0;
                    bVar6 = false;
                    if ((*(ushort *)(puVar2 + lVar21 + 6) & 0xff) == 0 &&
                        *(ushort *)(puVar2 + lVar21 + 6) >> 8 == 0) {
                      if ((int)(uint)(ushort)(*(ushort *)(puVar2 + lVar21 + 8) << 8 |
                                             *(ushort *)(puVar2 + lVar21 + 8) >> 8) <= (int)uVar17)
                      {
                        __assert_fail("coverageIndex < pairSetCount",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                                      ,0x9a1,
                                      "stbtt_int32 stbtt__GetGlyphGPOSInfoAdvance(const stbtt_fontinfo *, int, int)"
                                     );
                      }
                      uVar9 = (ulong)(ushort)(*(ushort *)
                                               (puVar2 + (long)(int)uVar17 * 2 + lVar21 + 10) << 8 |
                                             *(ushort *)
                                              (puVar2 + (long)(int)uVar17 * 2 + lVar21 + 10) >> 8);
                      lVar5 = uVar9 + lVar21;
                      iVar14 = (ushort)(*(ushort *)(puVar2 + uVar9 + lVar21) << 8 |
                                       *(ushort *)(puVar2 + uVar9 + lVar21) >> 8) - 1;
                      iVar16 = 0;
                      do {
                        bVar6 = iVar14 < iVar16;
                        uVar22 = uVar25;
                        if (iVar14 < iVar16) goto LAB_001337c7;
                        iVar19 = iVar16 + iVar14 >> 1;
                        lVar21 = (long)iVar19;
                        uVar17 = (uint)(ushort)(*(ushort *)(puVar2 + lVar21 * 4 + lVar5 + 2) << 8 |
                                               *(ushort *)(puVar2 + lVar21 * 4 + lVar5 + 2) >> 8);
                        if (g2 < (int)uVar17) {
                          iVar14 = iVar19 + -1;
                          bVar6 = true;
                        }
                        else if ((int)uVar17 < g2) {
                          iVar16 = iVar19 + 1;
                          bVar6 = true;
                        }
                        else {
                          uVar25 = (int)(short)((ushort)puVar2[lVar21 * 4 + lVar5 + 4] << 8) |
                                   (uint)puVar2[lVar21 * 4 + lVar5 + 5];
                          bVar6 = false;
                        }
                      } while (bVar6);
                      bVar6 = false;
                      uVar22 = uVar25;
                    }
                  }
                  else {
                    uVar22 = 0;
                  }
LAB_001337c7:
                  uVar25 = uVar22;
                  uVar17 = 1;
                  if (bVar6) {
LAB_001337d4:
                    uVar17 = 0;
                  }
                }
              }
              if ((uVar17 & 7) != 0) goto LAB_00133821;
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar7);
          }
          uVar17 = 5;
LAB_00133821:
          bVar6 = uVar17 == 0 || uVar17 == 5;
        }
        if (!bVar6) goto LAB_001333a6;
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar18);
      uVar25 = 0;
    }
  }
LAB_001333a6:
  lVar8 = (long)info->kern;
  if (lVar8 != 0) {
    puVar2 = info->data;
    uVar17 = 0;
    if (((puVar2[lVar8 + 3] != '\0' || puVar2[lVar8 + 2] != '\0') &&
        (uVar17 = 0,
        (ushort)(*(ushort *)(puVar2 + lVar8 + 8) << 8 | *(ushort *)(puVar2 + lVar8 + 8) >> 8) == 1))
       && (uVar18 = *(ushort *)(puVar2 + lVar8 + 10) << 8 | *(ushort *)(puVar2 + lVar8 + 10) >> 8,
          uVar18 != 0)) {
      uVar17 = g1 << 0x10 | g2;
      iVar14 = uVar18 - 1;
      iVar16 = 0;
      do {
        iVar19 = iVar16 + iVar14 >> 1;
        lVar3 = (long)iVar19 * 6;
        uVar22 = *(uint *)(puVar2 + lVar3 + lVar8 + 0x12);
        uVar22 = uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 | uVar22 << 0x18
        ;
        if (uVar17 < uVar22) {
          iVar14 = iVar19 + -1;
        }
        else {
          if (uVar17 <= uVar22) {
            uVar17 = (int)(short)((ushort)puVar2[lVar3 + lVar8 + 0x16] << 8) |
                     (uint)puVar2[lVar3 + lVar8 + 0x17];
            goto LAB_00133863;
          }
          iVar16 = iVar19 + 1;
        }
      } while (iVar16 <= iVar14);
      uVar17 = 0;
    }
LAB_00133863:
    uVar25 = uVar25 + uVar17;
  }
  return uVar25;
}

Assistant:

STBTT_DEF int  stbtt_GetGlyphKernAdvance(const stbtt_fontinfo *info, int g1, int g2)
{
   int xAdvance = 0;

   if (info->gpos)
      xAdvance += stbtt__GetGlyphGPOSInfoAdvance(info, g1, g2);

   if (info->kern)
      xAdvance += stbtt__GetGlyphKernInfoAdvance(info, g1, g2);

   return xAdvance;
}